

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_luv.c
# Opt level: O0

void Luv32toRGB(LogLuvState *sp,uint8_t *op,tmsize_t n)

{
  float local_3c [2];
  float xyz [3];
  uint8_t *rgb;
  uint32_t *luv;
  tmsize_t n_local;
  uint8_t *op_local;
  LogLuvState *sp_local;
  
  xyz._4_8_ = op;
  rgb = sp->tbuf;
  luv = (uint32_t *)n;
  while (0 < (long)luv) {
    LogLuv32toXYZ(*(uint32_t *)rgb,local_3c);
    XYZtoRGB24(local_3c,(uint8_t *)xyz._4_8_);
    xyz._4_8_ = xyz._4_8_ + 3;
    rgb = rgb + 4;
    luv = (uint32_t *)((long)luv + -1);
  }
  return;
}

Assistant:

static void Luv32toRGB(LogLuvState *sp, uint8_t *op, tmsize_t n)
{
    uint32_t *luv = (uint32_t *)sp->tbuf;
    uint8_t *rgb = (uint8_t *)op;

    while (n-- > 0)
    {
        float xyz[3];

        LogLuv32toXYZ(*luv++, xyz);
        XYZtoRGB24(xyz, rgb);
        rgb += 3;
    }
}